

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

void __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<4>::rehash(InnerLeaf<4> *this,int hashPos)

{
  array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *paVar1;
  unsigned_long uVar2;
  pair<int,_int> pVar3;
  u64 uVar4;
  ulong uVar5;
  long lVar6;
  int i_1;
  long lVar7;
  pair<int,_int> *val;
  int pos;
  int i;
  double local_38;
  
  (this->occupation).occupation = 0;
  paVar1 = &this->entries;
  val = (pair<int,_int> *)paVar1;
  for (lVar7 = 0; uVar5 = (ulong)this->size, lVar7 < (long)uVar5; lVar7 = lVar7 + 1) {
    uVar4 = HighsHashHelpers::hash<std::pair<int,_int>,_0>(val);
    uVar5 = uVar4 >> ((char)hashPos * -6 + 0x30U & 0x3f);
    (this->hashes)._M_elems[lVar7] = uVar5 & 0xffff;
    (this->occupation).occupation =
         (this->occupation).occupation | 1L << ((byte)(uVar5 >> 10) & 0x3f);
    val = val + 2;
  }
  i = 0;
  do {
    if ((int)uVar5 <= i) {
      return;
    }
    lVar6 = (long)i;
    uVar5 = (this->hashes)._M_elems[lVar6];
    lVar7 = POPCOUNT((this->occupation).occupation >> ((byte)(uVar5 >> 10) & 0x3f));
    pos = (int)lVar7 + -1;
    if (i < pos) {
      uVar2 = (this->hashes)._M_elems[pos];
      (this->hashes)._M_elems[pos] = uVar5;
      (this->hashes)._M_elems[lVar6] = uVar2;
      std::swap<HighsHashTableEntry<std::pair<int,int>,double>>
                (paVar1->_M_elems + pos,paVar1->_M_elems + lVar6);
    }
    else {
      for (; lVar7 + -1 < lVar6; lVar7 = lVar7 + 1) {
        if ((this->hashes)._M_elems[lVar7 + -1] < uVar5) {
          local_38 = (this->entries)._M_elems[lVar6].value_;
          pVar3 = paVar1->_M_elems[lVar6].key_;
          move_backward(this,&pos,&i);
          lVar7 = (long)pos;
          (this->hashes)._M_elems[lVar7] = uVar5;
          paVar1->_M_elems[lVar7].key_ = pVar3;
          (this->entries)._M_elems[lVar7].value_ = local_38;
          break;
        }
        pos = (int)lVar7;
      }
      i = i + 1;
    }
    uVar5 = (ulong)(uint)this->size;
  } while( true );
}

Assistant:

void rehash(int hashPos) {
      // function needs to possibly reorder elements by a different hash value
      // chances are very high we are already ordered correctly as we use 16
      // bits of the hash and one level is uses 6 bits, so the new values
      // are guaranteed to be ordered correctly by their 10 most significant
      // bits if increasing the hash position by 1 and only if the 10 bits of
      // the hash had a collision the new 6 bits might break a tie differently.
      // It is, however, important to maintain the exact ordering as otherwise
      // elements may not be found.
      occupation = 0;
      for (int i = 0; i < size; ++i) {
        hashes[i] = get_hash_chunks16(compute_hash(entries[i].key()), hashPos);
        occupation.set(get_first_chunk16(hashes[i]));
      }

      int i = 0;
      while (i < size) {
        uint8_t hashChunk = get_first_chunk16(hashes[i]);
        int pos = occupation.num_set_until(hashChunk) - 1;

        // if the position is after i the element definitely comes later, so we
        // swap it to that position and proceed without increasing i until
        // eventually an element appears that comes at position i or before
        if (pos > i) {
          std::swap(hashes[pos], hashes[i]);
          std::swap(entries[pos], entries[i]);
          continue;
        }

        // the position is before or at i, now check where the exact location
        // should be for the ordering by hash so that the invariant is that all
        // elements up to i are properly sorted. Essentially insertion sort but
        // with the modification of having a high chance to guess the correct
        // position already using the occupation flags.
        while (pos < i && hashes[pos] >= hashes[i]) ++pos;

        // if the final position is before i we need to move elements to
        // make space at that position, otherwise nothing needs to be done but
        // incrementing i increasing the sorted range by 1.
        if (pos < i) {
          uint64_t hash = hashes[i];
          auto entry = std::move(entries[i]);
          move_backward(pos, i);
          hashes[pos] = hash;
          entries[pos] = std::move(entry);
        }
        ++i;
      }
    }